

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

void BIT_addBits(BIT_CStream_t *bitC,size_t value,uint nbBits)

{
  uint nbBits_local;
  size_t value_local;
  BIT_CStream_t *bitC_local;
  
  if (0x1f < nbBits) {
    __assert_fail("nbBits < BIT_MASK_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bitstream.h"
                  ,0xb8,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
  }
  if (nbBits + bitC->bitPos < 0x40) {
    if (0x1f < nbBits) {
      __assert_fail("nbBits < BIT_MASK_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bitstream.h"
                    ,0xac,"size_t BIT_getLowerBits(size_t, const U32)");
    }
    bitC->bitContainer =
         (value & BIT_mask[nbBits]) << ((byte)bitC->bitPos & 0x3f) | bitC->bitContainer;
    bitC->bitPos = nbBits + bitC->bitPos;
    return;
  }
  __assert_fail("nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bitstream.h"
                ,0xb9,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
}

Assistant:

MEM_STATIC void BIT_addBits(BIT_CStream_t* bitC,
                            size_t value, unsigned nbBits)
{
    DEBUG_STATIC_ASSERT(BIT_MASK_SIZE == 32);
    assert(nbBits < BIT_MASK_SIZE);
    assert(nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8);
    bitC->bitContainer |= BIT_getLowerBits(value, nbBits) << bitC->bitPos;
    bitC->bitPos += nbBits;
}